

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setInputMethodHints(QWidget *this,InputMethodHints hints)

{
  long lVar1;
  bool bVar2;
  QWidgetPrivate *pQVar3;
  QFlags<Qt::InputMethodQuery> *pQVar4;
  QFlags_conflict1 *pQVar5;
  QFlags<Qt::InputMethodHint> in_ESI;
  QFlags<Qt::InputMethodQuery> *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QWidget *)0x37d41e);
  bVar2 = ::operator==((QFlags<Qt::InputMethodHint>)
                       (pQVar3->imHints).super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.
                       super_QFlagsStorage<Qt::InputMethodHint>.i,in_ESI);
  if (!bVar2) {
    (pQVar3->imHints).super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.
    super_QFlagsStorage<Qt::InputMethodHint>.i =
         (Int)in_ESI.super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.
              super_QFlagsStorage<Qt::InputMethodHint>.i;
    pQVar4 = (QFlags<Qt::InputMethodQuery> *)QGuiApplication::focusObject();
    if (in_RDI == pQVar4) {
      pQVar5 = (QFlags_conflict1 *)QGuiApplication::inputMethod();
      QFlags<Qt::InputMethodQuery>::QFlags(in_RDI,(InputMethodQuery)((ulong)pQVar5 >> 0x20));
      QInputMethod::update(pQVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setInputMethodHints(Qt::InputMethodHints hints)
{
#ifndef QT_NO_IM
    Q_D(QWidget);
    if (d->imHints == hints)
        return;
    d->imHints = hints;
    if (this == QGuiApplication::focusObject())
        QGuiApplication::inputMethod()->update(Qt::ImHints);
#else
    Q_UNUSED(hints);
#endif //QT_NO_IM
}